

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerGraphValidator.cpp
# Opt level: O2

bool __thiscall
dg::pta::PointerGraphValidator::reportInvalOperands
          (PointerGraphValidator *this,PSNode *nd,string *user_err)

{
  string *errors;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  errors = &this->errors;
  std::__cxx11::string::append((char *)errors);
  dumpNode(nd,errors);
  if (user_err->_M_string_length != 0) {
    std::operator+(&bStack_58,"(",user_err);
    std::operator+(&local_38,&bStack_58,")\n");
    std::__cxx11::string::append((string *)errors);
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
  }
  return true;
}

Assistant:

bool PointerGraphValidator::reportInvalOperands(const PSNode *nd,
                                                const std::string &user_err) {
    errors += "Invalid operands:\n";
    dumpNode(nd, errors);

    if (!user_err.empty())
        errors += "(" + user_err + ")\n";

    return true;
}